

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<7,4>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Type<7,4> *this,int zaid,double awr,int lat,int lasym,ScatteringLawConstants *constants,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  int in_stack_ffffffffffffff40;
  _Variant_storage<false,_njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
  local_b0;
  
  readScatteringLaw<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((ScatteringLaw *)&local_b0,(Type<7,4> *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)(ulong)(uint)MAT,MF,MT,in_stack_ffffffffffffff40,
             (constants->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start
             [*(long *)(&PTR_indices_001dd528)
                       [*(long *)&(constants->super_ListRecord).metadata.fields.
                                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                                  super__Tuple_impl<2UL,_long,_long,_long,_long>.
                                  super__Tuple_impl<3UL,_long,_long,_long>]]);
  Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (this,zaid,awr,lat,lasym,constants,(ScatteringLaw *)&local_b0,begin,end,lineNumber,MAT,
             MF,MT);
  std::__detail::__variant::
  _Variant_storage<false,_njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
  ::~_Variant_storage(&local_b0);
  return;
}

Assistant:

Type( int zaid, double awr, int lat, int lasym,
      ScatteringLawConstants&& constants,
      Iterator& begin,
      const Iterator& end,
      long& lineNumber,
      int MAT,
      int MF,
      int MT ) :
  Type( zaid, awr, lat, lasym,
        std::move( constants ),
        readScatteringLaw( begin, end, lineNumber, MAT, MF, MT,
                           constants.totalFreeCrossSections()[0] ),
        begin, end, lineNumber, MAT, MF, MT ) {}